

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rb_aug.c
# Opt level: O2

wtree_node_t * wtree_walk_next(wtree_walk *it,int dir,wtree_node_t **r_left,wtree_node_t **r_right)

{
  int *piVar1;
  wtree_node_t *pwVar2;
  int iVar3;
  wtree_node_t *pwVar4;
  int *piVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  wtree_node_t *pwVar9;
  
  uVar7 = it->count;
  lVar8 = (long)(int)uVar7;
  if (lVar8 == 0) {
    pwVar4 = it->path[0].node;
    if (pwVar4 == (wtree_node_t *)0x0) {
      return (wtree_node_t *)0x0;
    }
    it->count = 1;
  }
  else {
    pwVar2 = it->path[lVar8 + -1].node;
    it->path[lVar8 + -1].dir = dir;
    if ((((dir & 1U) == 0) || (pwVar4 = (pwVar2->in_tree).rbn_left, pwVar4 == (wtree_node_t *)0x0))
       && (((dir & 2U) == 0 ||
           (pwVar4 = (wtree_node_t *)((ulong)(pwVar2->in_tree).rbn_right_red & 0xfffffffffffffffe),
           pwVar4 == (wtree_node_t *)0x0)))) {
      piVar5 = &it->path[(ulong)uVar7 - 2].dir;
      uVar6 = uVar7 - 1;
      do {
        uVar7 = uVar6;
        pwVar9 = pwVar2;
        if ((int)(uVar7 + 1) < 2) {
          it->count = uVar7;
          pwVar4 = pwVar9;
          if (uVar7 == 0) {
            return (wtree_node_t *)0x0;
          }
          break;
        }
        pwVar2 = ((anon_struct_16_2_62ea00d6 *)(piVar5 + -2))->node;
        uVar6 = uVar7 - 1;
        piVar1 = piVar5 + -4;
        iVar3 = *piVar5;
        piVar5 = piVar1;
      } while ((((iVar3 & 2) == 0) ||
               (pwVar4 = (wtree_node_t *)
                         ((ulong)(pwVar2->in_tree).rbn_right_red & 0xfffffffffffffffe),
               pwVar4 == (wtree_node_t *)0x0)) || (pwVar9 == pwVar4));
    }
    it->count = uVar7 + 1;
    it->path[(int)uVar7].node = pwVar4;
  }
  *r_left = (pwVar4->in_tree).rbn_left;
  *r_right = (wtree_node_t *)((ulong)(pwVar4->in_tree).rbn_right_red & 0xfffffffffffffffe);
  return pwVar4;
}

Assistant:

static void
wtree_selfcheck(wtree_t *tree)
{
	wtree_node_t *node, *prev, *left, *right;

	/* Check node order. */
	struct wtree_iterator it;
	wtree_ifirst(tree, &it);
	prev = NULL;
	while ((node = wtree_inext(&it)) != NULL) {
		if (prev != NULL)
			fail_unless(prev->value <= node->value);
		prev = node;
	}

	/* Check node weights. */
	struct wtree_walk walk;
	wtree_walk_init(&walk, tree);
	while ((node = wtree_walk_next(&walk, RB_WALK_RIGHT | RB_WALK_LEFT,
				       &left, &right)) != NULL) {
		int left_weight = left != NULL ? left->weight : 0;
		int right_weight = right != NULL ? right->weight : 0;
		fail_unless(node->weight == left_weight + right_weight + 1);
	}
}